

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O1

void __thiscall leveldb::BlockBuilder::Add(BlockBuilder *this,Slice *key,Slice *value)

{
  string *this_00;
  string *dst;
  Comparator *pCVar1;
  iterator __position;
  size_t __n;
  int iVar2;
  ulong uVar3;
  ulong __n_00;
  size_type sVar4;
  long in_FS_OFFSET;
  Slice last_key_piece;
  uint local_4c;
  pointer local_48;
  size_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (this->last_key_)._M_dataplus._M_p;
  local_40 = (this->last_key_)._M_string_length;
  if (this->finished_ == true) {
    __assert_fail("!finished_",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/block_builder.cc"
                  ,0x4a,"void leveldb::BlockBuilder::Add(const Slice &, const Slice &)");
  }
  if (this->options_->block_restart_interval < this->counter_) {
    __assert_fail("counter_ <= options_->block_restart_interval",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/block_builder.cc"
                  ,0x4b,"void leveldb::BlockBuilder::Add(const Slice &, const Slice &)");
  }
  if (((this->buffer_)._M_string_length != 0) &&
     (pCVar1 = this->options_->comparator,
     iVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,key,&local_48), iVar2 < 1)) {
    __assert_fail("buffer_.empty() || options_->comparator->Compare(key, last_key_piece) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/block_builder.cc"
                  ,0x4d,"void leveldb::BlockBuilder::Add(const Slice &, const Slice &)");
  }
  this_00 = &this->last_key_;
  dst = &this->buffer_;
  if (this->counter_ < this->options_->block_restart_interval) {
    sVar4 = local_40;
    if (key->size_ < local_40) {
      sVar4 = key->size_;
    }
    if (sVar4 != 0) {
      uVar3 = 0;
      do {
        __n_00 = uVar3;
        if (local_48[uVar3] != key->data_[uVar3]) break;
        uVar3 = uVar3 + 1;
        __n_00 = sVar4;
      } while (sVar4 != uVar3);
      goto LAB_00d52771;
    }
  }
  else {
    local_4c = (uint)(this->buffer_)._M_string_length;
    __position._M_current =
         (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->restarts_,__position,&local_4c);
    }
    else {
      *__position._M_current = local_4c;
      (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->counter_ = 0;
  }
  __n_00 = 0;
LAB_00d52771:
  sVar4 = key->size_ - __n_00;
  PutVarint32(dst,(uint32_t)__n_00);
  PutVarint32(dst,(uint32_t)sVar4);
  PutVarint32(dst,(uint32_t)value->size_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (dst,key->data_ + __n_00,sVar4);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (dst,value->data_,value->size_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (this_00,__n_00,'\0');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this_00,key->data_ + __n_00,sVar4);
  __n = (this->last_key_)._M_string_length;
  if ((__n == key->size_) && (iVar2 = bcmp((this_00->_M_dataplus)._M_p,key->data_,__n), iVar2 == 0))
  {
    this->counter_ = this->counter_ + 1;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return;
  }
  __assert_fail("Slice(last_key_) == key",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/block_builder.cc"
                ,0x68,"void leveldb::BlockBuilder::Add(const Slice &, const Slice &)");
}

Assistant:

void BlockBuilder::Add(const Slice& key, const Slice& value) {
  Slice last_key_piece(last_key_);
  assert(!finished_);
  assert(counter_ <= options_->block_restart_interval);
  assert(buffer_.empty()  // No values yet?
         || options_->comparator->Compare(key, last_key_piece) > 0);
  size_t shared = 0;
  if (counter_ < options_->block_restart_interval) {
    // See how much sharing to do with previous string
    const size_t min_length = std::min(last_key_piece.size(), key.size());
    while ((shared < min_length) && (last_key_piece[shared] == key[shared])) {
      shared++;
    }
  } else {
    // Restart compression
    restarts_.push_back(buffer_.size());
    counter_ = 0;
  }
  const size_t non_shared = key.size() - shared;

  // Add "<shared><non_shared><value_size>" to buffer_
  PutVarint32(&buffer_, shared);
  PutVarint32(&buffer_, non_shared);
  PutVarint32(&buffer_, value.size());

  // Add string delta to buffer_ followed by value
  buffer_.append(key.data() + shared, non_shared);
  buffer_.append(value.data(), value.size());

  // Update state
  last_key_.resize(shared);
  last_key_.append(key.data() + shared, non_shared);
  assert(Slice(last_key_) == key);
  counter_++;
}